

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinVerticesProcess.cpp
# Opt level: O0

bool anon_unknown.dwarf_9cc85::areVerticesEqual(Vertex *lhs,Vertex *rhs,bool complex)

{
  bool bVar1;
  float fVar2;
  ai_real aVar3;
  aiVector3t<float> aVar4;
  aiVector3t<float> local_e0;
  aiVector3t<float> local_d0;
  int local_c4;
  float fStack_c0;
  int i;
  float local_b8;
  aiVector3t<float> local_ac;
  aiVector3t<float> local_a0;
  aiVector3t<float> local_8c;
  aiVector3t<float> local_80;
  aiVector3t<float> local_6c;
  aiVector3t<float> local_60;
  aiVector3t<float> local_4c;
  aiVector3t<float> local_40;
  aiVector3t<float> local_30;
  byte local_21;
  Vertex *pVStack_20;
  bool complex_local;
  Vertex *rhs_local;
  Vertex *lhs_local;
  
  local_21 = complex;
  pVStack_20 = rhs;
  rhs_local = lhs;
  aVar4 = ::operator-(&lhs->position,&rhs->position);
  local_40._0_8_ = aVar4._0_8_;
  local_30.x = local_40.x;
  local_30.y = local_40.y;
  local_40.z = aVar4.z;
  local_30.z = local_40.z;
  local_40 = aVar4;
  fVar2 = aiVector3t<float>::SquareLength(&local_30);
  if (fVar2 <= 9.9999994e-11) {
    aVar4 = ::operator-(&rhs_local->normal,&pVStack_20->normal);
    local_60._0_8_ = aVar4._0_8_;
    local_4c.x = local_60.x;
    local_4c.y = local_60.y;
    local_60.z = aVar4.z;
    local_4c.z = local_60.z;
    local_60 = aVar4;
    fVar2 = aiVector3t<float>::SquareLength(&local_4c);
    if (fVar2 <= 9.9999994e-11) {
      aVar4 = ::operator-(rhs_local->texcoords,pVStack_20->texcoords);
      local_80._0_8_ = aVar4._0_8_;
      local_6c.x = local_80.x;
      local_6c.y = local_80.y;
      local_80.z = aVar4.z;
      local_6c.z = local_80.z;
      local_80 = aVar4;
      fVar2 = aiVector3t<float>::SquareLength(&local_6c);
      if (fVar2 <= 9.9999994e-11) {
        aVar4 = ::operator-(&rhs_local->tangent,&pVStack_20->tangent);
        local_a0._0_8_ = aVar4._0_8_;
        local_8c.x = local_a0.x;
        local_8c.y = local_a0.y;
        local_a0.z = aVar4.z;
        local_8c.z = local_a0.z;
        local_a0 = aVar4;
        fVar2 = aiVector3t<float>::SquareLength(&local_8c);
        if (fVar2 <= 9.9999994e-11) {
          aVar4 = ::operator-(&rhs_local->bitangent,&pVStack_20->bitangent);
          _fStack_c0 = aVar4._0_8_;
          local_ac.x = fStack_c0;
          local_ac.y = (float)i;
          local_b8 = aVar4.z;
          local_ac.z = local_b8;
          _fStack_c0 = aVar4;
          fVar2 = aiVector3t<float>::SquareLength(&local_ac);
          if (fVar2 <= 9.9999994e-11) {
            if ((local_21 & 1) != 0) {
              for (local_c4 = 0; local_c4 < 8; local_c4 = local_c4 + 1) {
                bVar1 = false;
                if (0 < local_c4) {
                  aVar4 = ::operator-(rhs_local->texcoords + local_c4,
                                      pVStack_20->texcoords + local_c4);
                  local_e0._0_8_ = aVar4._0_8_;
                  local_d0.x = local_e0.x;
                  local_d0.y = local_e0.y;
                  local_e0.z = aVar4.z;
                  local_d0.z = local_e0.z;
                  fVar2 = aiVector3t<float>::SquareLength(&local_d0);
                  bVar1 = 9.9999994e-11 < fVar2;
                }
                if (bVar1) {
                  return false;
                }
                aVar3 = Assimp::GetColorDifference
                                  (rhs_local->colors + local_c4,pVStack_20->colors + local_c4);
                if (9.9999994e-11 < aVar3) {
                  return false;
                }
              }
            }
            lhs_local._7_1_ = true;
          }
          else {
            lhs_local._7_1_ = false;
          }
        }
        else {
          lhs_local._7_1_ = false;
        }
      }
      else {
        lhs_local._7_1_ = false;
      }
    }
    else {
      lhs_local._7_1_ = false;
    }
  }
  else {
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

bool areVerticesEqual(const Vertex &lhs, const Vertex &rhs, bool complex)
{
    // A little helper to find locally close vertices faster.
    // Try to reuse the lookup table from the last step.
    const static float epsilon = 1e-5f;
    // Squared because we check against squared length of the vector difference
    static const float squareEpsilon = epsilon * epsilon;

    // Square compare is useful for animeshes vertices compare
    if ((lhs.position - rhs.position).SquareLength() > squareEpsilon) {
        return false;
    }

    // We just test the other attributes even if they're not present in the mesh.
    // In this case they're initialized to 0 so the comparison succeeds.
    // By this method the non-present attributes are effectively ignored in the comparison.
    if ((lhs.normal - rhs.normal).SquareLength() > squareEpsilon) {
        return false;
    }

    if ((lhs.texcoords[0] - rhs.texcoords[0]).SquareLength() > squareEpsilon) {
        return false;
    }

    if ((lhs.tangent - rhs.tangent).SquareLength() > squareEpsilon) {
        return false;
    }

    if ((lhs.bitangent - rhs.bitangent).SquareLength() > squareEpsilon) {
        return false;
    }

    // Usually we won't have vertex colors or multiple UVs, so we can skip from here
    // Actually this increases runtime performance slightly, at least if branch
    // prediction is on our side.
    if (complex) {
        for (int i = 0; i < 8; i++) {
            if (i > 0 && (lhs.texcoords[i] - rhs.texcoords[i]).SquareLength() > squareEpsilon) {
                return false;
            }
            if (GetColorDifference(lhs.colors[i], rhs.colors[i]) > squareEpsilon) {
                return false;
            }
        }
    }
    return true;
}